

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::evaluateCollocationConstraintJacobian
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  MatrixDynSize *pMVar1;
  DynamicalSystem *this_00;
  element_type *peVar2;
  double dVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  char *pcVar13;
  pointer pcVar14;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_258;
  ulong local_230;
  double local_228;
  MatrixDynSize *local_220;
  MatrixDynSize *local_218;
  MatrixDynSize *local_210;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_208;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1e8;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (DynamicalSystem *)0x0) {
    psVar11 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar14 = (psVar11->_M_dataplus)._M_p;
    pcVar13 = "evaluateCollocationConstraint";
    pcVar12 = "Dynamical system not set.";
LAB_001a847b:
    iDynTree::reportError(pcVar14,pcVar13,pcVar12);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        local_228 = dT;
        sVar5 = DynamicalSystem::stateSpaceSize(this_00);
        sVar6 = DynamicalSystem::controlSpaceSize
                          ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if ((long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (stateJacobianValues,2);
        }
        if ((long)(controlJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(controlJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (controlJacobianValues,2);
        }
        uVar7 = iDynTree::MatrixDynSize::rows();
        uVar9 = sVar5 & 0xffffffff;
        if ((uVar7 != uVar9) || (uVar8 = iDynTree::MatrixDynSize::cols(), uVar8 != uVar7)) {
          iDynTree::MatrixDynSize::resize
                    ((ulong)(stateJacobianValues->
                            super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                            )._M_impl.super__Vector_impl_data._M_start,uVar9);
        }
        peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar4 = (*peVar2->_vptr_DynamicalSystem[3])
                          (peVar2,(controlInputs->
                                  super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar4 == '\0') {
LAB_001a8796:
          psVar11 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar14 = (psVar11->_M_dataplus)._M_p;
          pcVar13 = "evaluateCollocationConstraintJacobian";
          pcVar12 = "Error while setting the control input.";
        }
        else {
          peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pMVar1 = &this->m_stateJacBuffer;
          iVar4 = (*peVar2->_vptr_DynamicalSystem[9])
                            (SUB84(time,0),peVar2,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,pMVar1);
          if ((char)iVar4 == '\0') {
LAB_001a87b8:
            psVar11 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar14 = (psVar11->_M_dataplus)._M_p;
            pcVar13 = "evaluateCollocationConstraintJacobian";
            pcVar12 = "Error while evaluating the dynamical system jacobian.";
            goto LAB_001a847b;
          }
          local_218 = &this->m_identity;
          toEigen(&local_258,local_218);
          local_210 = pMVar1;
          toEigen(&local_208,pMVar1);
          _errorMsg = local_258.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          local_230 = uVar9;
          toEigen(&local_1e8,
                  (stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start);
          uVar7 = local_230;
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>const>>
                    (&local_1e8,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)&errorMsg);
          uVar9 = iDynTree::MatrixDynSize::rows();
          if ((uVar9 != uVar7) ||
             (uVar9 = iDynTree::MatrixDynSize::cols(), uVar9 != (sVar6 & 0xffffffff))) {
            iDynTree::MatrixDynSize::resize
                      ((ulong)(controlJacobianValues->
                              super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                              )._M_impl.super__Vector_impl_data._M_start,uVar7);
          }
          peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pMVar1 = &this->m_controlJacBuffer;
          iVar4 = (*peVar2->_vptr_DynamicalSystem[10])
                            (SUB84(time,0),peVar2,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,pMVar1);
          if ((char)iVar4 != '\0') {
            local_220 = pMVar1;
            toEigen(&local_258,pMVar1);
            toEigen(&local_208,
                    (controlJacobianValues->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start);
            uVar7 = local_230;
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>
                      (&local_208,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)&errorMsg);
            uVar9 = iDynTree::MatrixDynSize::rows();
            if ((uVar9 != uVar7) || (uVar9 = iDynTree::MatrixDynSize::cols(), uVar9 != uVar7)) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((stateJacobianValues->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar7);
            }
            peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar4 = (*peVar2->_vptr_DynamicalSystem[3])
                              (peVar2,(controlInputs->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20);
            pMVar1 = local_210;
            if ((char)iVar4 == '\0') goto LAB_001a8796;
            peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            dVar3 = time + local_228;
            iVar4 = (*peVar2->_vptr_DynamicalSystem[9])
                              (peVar2,(collocationPoints->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20,local_210);
            if ((char)iVar4 == '\0') goto LAB_001a87b8;
            toEigen(&local_208,local_218);
            local_258.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value =
                 local_208.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
            local_258.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_208.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
            local_258.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value =
                 local_208.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
            toEigen(&local_1e8,pMVar1);
            toEigen(&local_50,
                    (stateJacobianValues->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x28);
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>const>>
                      (&local_50,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)&errorMsg);
            uVar9 = iDynTree::MatrixDynSize::rows();
            if ((uVar9 != uVar7) ||
               (uVar9 = iDynTree::MatrixDynSize::cols(), uVar9 != (sVar6 & 0xffffffff))) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((controlJacobianValues->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar7);
            }
            pMVar1 = local_220;
            peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar4 = (*peVar2->_vptr_DynamicalSystem[10])
                              (SUB84(dVar3,0),peVar2,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + 0x20,local_220);
            if ((char)iVar4 != '\0') {
              toEigen(&local_258,pMVar1);
              toEigen(&local_208,
                      (controlJacobianValues->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start + 0x28);
              Eigen::internal::
              call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>
                        (&local_208,
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)&errorMsg);
              return true;
            }
          }
          psVar11 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar14 = (psVar11->_M_dataplus)._M_p;
          pcVar13 = "evaluateCollocationConstraintJacobian";
          pcVar12 = "Error while evaluating the dynamical system control jacobian.";
        }
        goto LAB_001a847b;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the control inputs does not match the expected one. Input = "
                     );
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar10,", Expected = 2.");
      psVar11 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar12 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar12,"evaluateCollocationConstraintJacobian",
                 (char *)local_258.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar10,", Expected = 2.");
      psVar11 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar12 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar12,"evaluateCollocationConstraintJacobian",
                 (char *)local_258.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                            const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                            std::vector<MatrixDynSize> &stateJacobianValues,
                                                                            std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }


                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT/2.0*toEigen(m_controlJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[1], time+dT, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[1], time + dT, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[1]) = dT/2.0*toEigen(m_controlJacBuffer);

                return true;

            }